

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall Js::ByteCodeWriter::AllocateLoopHeaders(ByteCodeWriter *this)

{
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  Type pLVar2;
  LoopHeader *pLVar3;
  long lVar4;
  long lVar5;
  
  FunctionBody::AllocateLoopHeaders(this->m_functionWrite);
  pLVar1 = this->m_loopHeaders;
  if (0 < (pLVar1->
          super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
          ).count) {
    lVar4 = 9;
    lVar5 = 0;
    do {
      pLVar2 = (pLVar1->
               super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
               ).buffer;
      pLVar3 = FunctionBody::GetLoopHeader(this->m_functionWrite,(uint)lVar5);
      pLVar3->startOffset = *(Type *)((long)pLVar2 + lVar4 + -9);
      pLVar3->endOffset = *(Type *)((long)pLVar2 + lVar4 + -5);
      pLVar3->isNested = *(Type *)((long)pLVar2 + lVar4 + -1);
      pLVar3->hasYield = *(Type *)((long)&pLVar2->startOffset + lVar4);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar5 < (pLVar1->
                     super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
                     ).count);
  }
  return;
}

Assistant:

void ByteCodeWriter::AllocateLoopHeaders()
    {
        m_functionWrite->AllocateLoopHeaders();
        m_loopHeaders->Map([this](int index, ByteCodeWriter::LoopHeaderData& data)
        {
            LoopHeader *loopHeader = m_functionWrite->GetLoopHeader(index);
            loopHeader->startOffset = data.startOffset;
            loopHeader->endOffset = data.endOffset;
            loopHeader->isNested = data.isNested;
            loopHeader->hasYield = data.hasYield;
        });
    }